

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O1

void __thiscall QDnsLookupRunnable::run(QDnsLookupRunnable *this)

{
  quint16 qVar1;
  QDnsServiceRecordPrivate *pQVar2;
  QDebug this_00;
  undefined8 uVar3;
  uint uVar4;
  iterator __first;
  iterator __last;
  ulong uVar5;
  ulong uVar6;
  pointer pQVar7;
  iterator __first_00;
  iterator __last_00;
  pointer pQVar8;
  void *pvVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long in_FS_OFFSET;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QDebug local_180;
  QDebug local_178;
  undefined1 local_170 [16];
  QList<QDnsServiceRecord> local_160;
  QDnsLookupReply local_148;
  QArrayDataPointer<QDnsServiceRecord> local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_148,0xaa,0xf0);
  local_148.error = NoError;
  local_148.authenticData = false;
  local_148.sslConfiguration.super__Optional_base<QSslConfiguration,_false,_false>._M_payload.
  super__Optional_payload<QSslConfiguration,_true,_false,_false>.
  super__Optional_payload_base<QSslConfiguration>._M_engaged = false;
  memset(&local_148.errorString,0,0xd8);
  if ((this->requestName).d.size - 0x100U < 0xffffffffffffff01) {
    local_148.error = InvalidRequestError;
    QMetaObject::tr((char *)&local_58,(char *)&QDnsLookup::staticMetaObject,0x28026c);
    local_58.d._0_4_ = SUB84(local_148.errorString.d.d,0);
    local_58.d._4_4_ = (undefined4)((ulong)local_148.errorString.d.d >> 0x20);
    local_58.ptr._0_4_ = SUB84(local_148.errorString.d.ptr,0);
    local_58.ptr._4_4_ = (undefined4)((ulong)local_148.errorString.d.ptr >> 0x20);
    local_58.size._0_4_ = (undefined4)local_148.errorString.d.size;
    local_58.size._4_4_ = (undefined4)((ulong)local_148.errorString.d.size >> 0x20);
    if (&(local_148.errorString.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_148.errorString.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_148.errorString.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_148.errorString.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_148.errorString.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else {
    query(this,&local_148);
    if (1 < (ulong)local_148.mailExchangeRecords.d.size) {
      __first = QList<QDnsMailExchangeRecord>::begin(&local_148.mailExchangeRecords);
      __last = QList<QDnsMailExchangeRecord>::end(&local_148.mailExchangeRecords);
      if (__first.i != __last.i) {
        uVar5 = (long)__last.i - (long)__first.i >> 3;
        lVar13 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QDnsMailExchangeRecord>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsMailExchangeRecord_const&,QDnsMailExchangeRecord_const&)>>
                  (__first,__last,(ulong)(((uint)lVar13 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_QDnsMailExchangeRecord_&,_const_QDnsMailExchangeRecord_&)>
                    )0x22c12d);
        std::
        __final_insertion_sort<QList<QDnsMailExchangeRecord>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsMailExchangeRecord_const&,QDnsMailExchangeRecord_const&)>>
                  (__first,__last,
                   (_Iter_comp_iter<bool_(*)(const_QDnsMailExchangeRecord_&,_const_QDnsMailExchangeRecord_&)>
                    )0x22c12d);
      }
      if (local_148.mailExchangeRecords.d.size != 0) {
        lVar16 = 0;
        lVar13 = 0;
        do {
          local_58.d._0_4_ = 0;
          local_58.d._4_4_ = 0;
          local_58.ptr._0_4_ = 0;
          local_58.ptr._4_4_ = 0;
          local_58.size._0_4_ = 0;
          local_58.size._4_4_ = 0;
          lVar18 = (long)(int)lVar13;
          if (lVar18 < local_148.mailExchangeRecords.d.size) {
            qVar1 = (local_148.mailExchangeRecords.d.ptr[lVar16].d.d.ptr)->preference;
            lVar16 = lVar18 * 8;
            lVar12 = lVar18;
            do {
              if (*(quint16 *)
                   (*(long *)((long)&((local_148.mailExchangeRecords.d.ptr)->d).d.ptr + lVar16) +
                   0x40) != qVar1) break;
              QtPrivate::QMovableArrayOps<QDnsMailExchangeRecord>::
              emplace<QDnsMailExchangeRecord_const&>
                        ((QMovableArrayOps<QDnsMailExchangeRecord> *)&local_58,
                         CONCAT44(local_58.size._4_4_,(undefined4)local_58.size),
                         (QDnsMailExchangeRecord *)
                         ((long)&((local_148.mailExchangeRecords.d.ptr)->d).d.ptr + lVar16));
              QList<QDnsMailExchangeRecord>::end((QList<QDnsMailExchangeRecord> *)&local_58);
              lVar12 = lVar12 + 1;
              lVar16 = lVar16 + 8;
            } while (lVar12 < local_148.mailExchangeRecords.d.size);
          }
          uVar5 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
          if (uVar5 != 0) {
            pvVar9 = (void *)QRandomGenerator64::global();
            do {
              uVar6 = uVar5 - 1;
              if (uVar6 == 0) {
                bVar10 = 0;
              }
              else {
                lVar13 = 0x3f;
                if (uVar6 != 0) {
                  for (; uVar6 >> lVar13 == 0; lVar13 = lVar13 + -1) {
                  }
                }
                bVar10 = (byte)lVar13 ^ 0x3f;
              }
              do {
                uVar6 = QRandomGenerator::_fillRange(pvVar9,0);
              } while (uVar5 <= (uVar6 & ~(-1L << (-bVar10 & 0x3f))));
              QList<QDnsMailExchangeRecord>::takeAt
                        ((QList<QDnsMailExchangeRecord> *)&local_160,(qsizetype)&local_58);
              lVar13 = lVar18 + 1;
              pQVar7 = QList<QDnsMailExchangeRecord>::data(&local_148.mailExchangeRecords);
              pQVar2 = (QDnsServiceRecordPrivate *)pQVar7[lVar18].d.d.ptr;
              pQVar7[lVar18].d.d.ptr = (QDnsMailExchangeRecordPrivate *)local_160.d.d;
              local_160.d.d = (Data *)pQVar2;
              QDnsMailExchangeRecord::~QDnsMailExchangeRecord((QDnsMailExchangeRecord *)&local_160);
              uVar5 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
              lVar18 = lVar13;
            } while (uVar5 != 0);
          }
          QArrayDataPointer<QDnsMailExchangeRecord>::~QArrayDataPointer
                    ((QArrayDataPointer<QDnsMailExchangeRecord> *)&local_58);
          lVar16 = (long)(int)lVar13;
        } while (lVar16 < local_148.mailExchangeRecords.d.size);
      }
    }
    if (1 < (ulong)local_148.serviceRecords.d.size) {
      __first_00 = QList<QDnsServiceRecord>::begin(&local_148.serviceRecords);
      __last_00 = QList<QDnsServiceRecord>::end(&local_148.serviceRecords);
      if (__first_00.i != __last_00.i) {
        uVar5 = (long)__last_00.i - (long)__first_00.i >> 3;
        lVar13 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        std::
        __introsort_loop<QList<QDnsServiceRecord>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsServiceRecord_const&,QDnsServiceRecord_const&)>>
                  (__first_00,__last_00,(ulong)(((uint)lVar13 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_QDnsServiceRecord_&,_const_QDnsServiceRecord_&)>)
                   0x22c143);
        std::
        __final_insertion_sort<QList<QDnsServiceRecord>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QDnsServiceRecord_const&,QDnsServiceRecord_const&)>>
                  (__first_00,__last_00,
                   (_Iter_comp_iter<bool_(*)(const_QDnsServiceRecord_&,_const_QDnsServiceRecord_&)>)
                   0x22c143);
      }
      if (local_148.serviceRecords.d.size != 0) {
        lVar13 = 0;
        iVar17 = 0;
        do {
          local_58.d._0_4_ = 0;
          local_58.d._4_4_ = 0;
          local_58.ptr._0_4_ = 0;
          local_58.ptr._4_4_ = 0;
          local_58.size._0_4_ = 0;
          local_58.size._4_4_ = 0;
          lVar16 = (long)iVar17;
          iVar11 = 0;
          if (lVar16 < local_148.serviceRecords.d.size) {
            qVar1 = (local_148.serviceRecords.d.ptr[lVar13].d.d.ptr)->priority;
            lVar13 = lVar16 * 8;
            iVar11 = 0;
            do {
              lVar18 = *(long *)((long)&((local_148.serviceRecords.d.ptr)->d).d.ptr + lVar13);
              if (*(quint16 *)(lVar18 + 0x42) != qVar1) break;
              iVar11 = iVar11 + (uint)*(ushort *)(lVar18 + 0x44);
              QtPrivate::QMovableArrayOps<QDnsServiceRecord>::emplace<QDnsServiceRecord_const&>
                        ((QMovableArrayOps<QDnsServiceRecord> *)&local_58,
                         CONCAT44(local_58.size._4_4_,(undefined4)local_58.size),
                         (QDnsServiceRecord *)
                         ((long)&((local_148.serviceRecords.d.ptr)->d).d.ptr + lVar13));
              QList<QDnsServiceRecord>::end((QList<QDnsServiceRecord> *)&local_58);
              lVar16 = lVar16 + 1;
              lVar13 = lVar13 + 8;
            } while (lVar16 < local_148.serviceRecords.d.size);
          }
          if (CONCAT44(local_58.size._4_4_,(undefined4)local_58.size) != 0) {
            pvVar9 = (void *)QRandomGenerator64::global();
            do {
              uVar4 = QRandomGenerator::_fillRange(pvVar9,0);
              if (CONCAT44(local_58.size._4_4_,(undefined4)local_58.size) != 0) {
                lVar13 = 0;
                uVar14 = 0;
                do {
                  uVar15 = (uint)*(ushort *)
                                  (*(long *)(CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_) +
                                            lVar13 * 8) + 0x44);
                  uVar14 = uVar14 + uVar15;
                  if ((uint)((ulong)(iVar11 + 1) * (ulong)uVar4 >> 0x20) <= uVar14) {
                    iVar11 = iVar11 - uVar15;
                    QList<QDnsServiceRecord>::takeAt(&local_160,(qsizetype)&local_58);
                    pQVar8 = QList<QDnsServiceRecord>::data(&local_148.serviceRecords);
                    pQVar2 = pQVar8[iVar17].d.d.ptr;
                    pQVar8[iVar17].d.d.ptr = (QDnsServiceRecordPrivate *)local_160.d.d;
                    local_160.d.d = (Data *)pQVar2;
                    QDnsServiceRecord::~QDnsServiceRecord((QDnsServiceRecord *)&local_160);
                    iVar17 = iVar17 + 1;
                    break;
                  }
                  lVar13 = lVar13 + 1;
                } while (CONCAT44(local_58.size._4_4_,(undefined4)local_58.size) != lVar13);
              }
            } while (CONCAT44(local_58.size._4_4_,(undefined4)local_58.size) != 0);
          }
          QArrayDataPointer<QDnsServiceRecord>::~QArrayDataPointer(&local_58);
          lVar13 = (long)iVar17;
        } while (lVar13 < local_148.serviceRecords.d.size);
      }
    }
  }
  local_58.d._0_4_ = 0;
  local_58.d._4_4_ = 0;
  local_58.ptr = (QDnsServiceRecord *)&local_148;
  QMetaObject::activate(&this->super_QObject,&staticMetaObject,0,&local_58.d);
  if ((local_148.error < ServerFailureError) && ((0x1aU >> (local_148.error & 0x1f) & 1) != 0)) {
    if (lcDnsLookup()::category == '\0') {
      run();
    }
    if ((lcDnsLookup()::category[0x11] & 1) != 0) {
      local_58.d._0_4_ = 2;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_58.size._4_4_ = 0;
      local_40 = lcDnsLookup()::category._8_8_;
      QMessageLogger::warning();
      this_00.stream = local_180.stream;
      *(QTextStream *)(local_180.stream + 0x30) = (QTextStream)0x0;
      QVar19.m_data = (storage_type *)0x13;
      QVar19.m_size = (qsizetype)&local_160;
      QString::fromUtf8(QVar19);
      QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)&local_160);
      if ((QDnsServiceRecordPrivate *)local_160.d.d != (QDnsServiceRecordPrivate *)0x0) {
        LOCK();
        (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
              super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)
            (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
            super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int> == 0) {
          QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_180.stream + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_180.stream,' ');
      }
      local_178.stream = local_180.stream;
      *(int *)(local_180.stream + 0x28) = *(int *)(local_180.stream + 0x28) + 1;
      qt_QMetaEnum_debugOperator
                ((QDebug *)local_170,(longlong)&local_178,(QMetaObject *)(ulong)local_148.error,
                 (char *)&QDnsLookup::staticMetaObject);
      uVar3 = local_170._0_8_;
      QVar20.m_data = (storage_type *)0x3;
      QVar20.m_size = (qsizetype)&local_160;
      QString::fromUtf8(QVar20);
      QTextStream::operator<<((QTextStream *)uVar3,(QString *)&local_160);
      if ((QDnsServiceRecordPrivate *)local_160.d.d != (QDnsServiceRecordPrivate *)0x0) {
        LOCK();
        (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
              super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)
            (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
            super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int> == 0) {
          QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_170._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_170._0_8_,' ');
      }
      pvVar9 = (void *)QString::utf16();
      QTextStream::operator<<((QTextStream *)local_170._0_8_,pvVar9);
      if (*(QTextStream *)(local_170._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_170._0_8_,' ');
      }
      uVar3 = local_170._0_8_;
      QVar21.m_data = (storage_type *)0xe;
      QVar21.m_size = (qsizetype)&local_160;
      QString::fromUtf8(QVar21);
      QTextStream::operator<<((QTextStream *)uVar3,(QString *)&local_160);
      if ((QDnsServiceRecordPrivate *)local_160.d.d != (QDnsServiceRecordPrivate *)0x0) {
        LOCK();
        (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
              super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int> + -1);
        UNLOCK();
        if ((__int_type)
            (((QDnsRecordPrivate *)&(local_160.d.d)->super_QArrayData)->super_QSharedData).ref.
            super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int> == 0) {
          QArrayData::deallocate(&(local_160.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (*(QTextStream *)(local_170._0_8_ + 0x30) == (QTextStream)0x1) {
        QTextStream::operator<<((QTextStream *)local_170._0_8_,' ');
      }
      ::operator<<((QDebug *)(local_170 + 8),(QDnsLookupRunnable *)local_170);
      QDebug::~QDebug((QDebug *)(local_170 + 8));
      QDebug::~QDebug((QDebug *)local_170);
      QDebug::~QDebug(&local_178);
      QDebug::~QDebug(&local_180);
    }
  }
  QDnsLookupReply::~QDnsLookupReply(&local_148);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDnsLookupRunnable::run()
{
    QDnsLookupReply reply;

    // Validate input.
    if (qsizetype n = requestName.size(); n > MaxDomainNameLength || n == 0) {
        reply.error = QDnsLookup::InvalidRequestError;
        reply.errorString = QDnsLookup::tr("Invalid domain name");
    } else {
        // Perform request.
        query(&reply);

        // Sort results.
        qt_qdnsmailexchangerecord_sort(reply.mailExchangeRecords);
        qt_qdnsservicerecord_sort(reply.serviceRecords);
    }

    emit finished(reply);

    // maybe print the lookup error as warning
    switch (reply.error) {
    case QDnsLookup::NoError:
    case QDnsLookup::OperationCancelledError:
    case QDnsLookup::NotFoundError:
    case QDnsLookup::ServerFailureError:
    case QDnsLookup::ServerRefusedError:
    case QDnsLookup::TimeoutError:
        break;      // no warning for these

    case QDnsLookup::ResolverError:
    case QDnsLookup::InvalidRequestError:
    case QDnsLookup::InvalidReplyError:
        qCWarning(lcDnsLookup()).nospace()
                << "DNS lookup failed (" << reply.error << "): "
              << qUtf16Printable(reply.errorString)
              << "; request was " << this;  // continues below
    }
}